

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

optional<int32_t> __thiscall Command::Arg::find_constant(Arg *this,string_view *value)

{
  bool bVar1;
  __shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *value_00;
  shared_ptr<Enum> *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_> *__range2;
  string_view *value_local;
  Arg *this_local;
  optional<int32_t> *opt;
  
  __end2 = std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>::begin
                     ((vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_> *)
                      &value->__size);
  e = (shared_ptr<Enum> *)
      std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>::end
                ((vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_> *)
                 &value->__size);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<Enum>_*,_std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>_>
                                *)&e);
    if (!bVar1) {
      std::experimental::optional<int>::optional((optional<int> *)this);
      return (optional<int32_t>)(OptionalBase<int>)this;
    }
    this_00 = (__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Enum>_*,_std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>_>
              ::operator*(&__end2);
    value_00 = std::__shared_ptr_access<Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (this_00);
    Enum::find((Enum *)this,(string_view *)value_00);
    bVar1 = std::experimental::optional::operator_cast_to_bool((optional *)this);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Enum>_*,_std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>_>
    ::operator++(&__end2);
  }
  return (optional<int32_t>)(OptionalBase<int>)this;
}

Assistant:

::optional<int32_t> find_constant(const string_view& value) const
        {
            for(auto& e : enums)
            {
                if(auto opt = e->find(value))
                    return opt;
            }
            return nullopt;
        }